

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

int __thiscall diy::FileStorage::put(FileStorage *this,void *x,Save *save)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sz;
  int iVar2;
  undefined8 uVar3;
  string filename;
  FileBuffer fb;
  void *local_70;
  string local_68;
  BinaryBuffer local_48;
  FILE *local_40;
  size_t local_38;
  undefined8 uStack_30;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  iVar2 = open_random(this,&local_68);
  local_40 = fdopen(iVar2,"w");
  local_48._vptr_BinaryBuffer = (_func_int **)&PTR__BinaryBuffer_0013c6c8;
  local_38 = 0;
  uStack_30 = 0;
  local_70 = x;
  if ((save->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*save->_M_invoker)((_Any_data *)save,&local_70,&local_48);
    sz = local_38;
    fclose(local_40);
    fsync(iVar2);
    iVar2 = make_file_record(this,&local_68,sz);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    return iVar2;
  }
  uVar3 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

virtual int    put(const void* x, detail::Save save) override
      {
        std::string     filename;
        int fh = open_random(filename);
#if defined(_WIN32)
        detail::FileBuffer fb(_fdopen(fh, "wb"));
#else
        detail::FileBuffer fb(fdopen(fh, "w"));
#endif
        save(x, fb);
        size_t sz = fb.size();
        fclose(fb.file);
        io::utils::sync(fh);

        return make_file_record(filename, sz);
      }